

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O2

Variant * Jinx::Impl::AnyIsFinished
                    (Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  ScriptIPtr s;
  CollectionPtr collPtr;
  undefined1 local_58 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_58._16_8_ = script;
  Variant::GetCollection((Variant *)(local_58 + 0x18));
  for (p_Var2 = *(_Rb_tree_node_base **)(local_58._24_8_ + 0x18);
      p_Var2 != (_Rb_tree_node_base *)(local_58._24_8_ + 8);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if (*(int *)&p_Var2[2]._M_parent != 8) {
      std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>
                ((shared_ptr<Jinx::IScript> *)local_58);
      Script::Error((Script *)local_58._0_8_,
                    "Invalid parameters to \'any (of) {} (is) finished\' function");
      Variant::Variant(__return_storage_ptr__,false);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
      goto LAB_001189b8;
    }
    Variant::GetCoroutine((Variant *)local_58);
    iVar1 = (**((IScript *)local_58._0_8_)->_vptr_IScript)();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    if ((char)iVar1 != '\0') break;
  }
  Variant::Variant(__return_storage_ptr__,p_Var2 != (_Rb_tree_node_base *)(local_58._24_8_ + 8));
LAB_001189b8:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant AnyIsFinished(ScriptPtr script, const Parameters & params)
	{
		auto collPtr = params[0].GetCollection();
		bool anyFinished = false;
		for (const auto & pair : *collPtr)
		{
			if (!pair.second.IsCoroutine())
			{
				ScriptIPtr s = std::static_pointer_cast<Script>(script);
				s->Error("Invalid parameters to 'any (of) {} (is) finished' function");
				return false;
			}
			if (pair.second.GetCoroutine()->IsFinished())
			{
				anyFinished = true;
				break;
			}
		}
		return anyFinished;
	}